

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::MatchingTest_MatchAndModifiedInterleaveProperly_Test::TestBody
          (MatchingTest_MatchAndModifiedInterleaveProperly_Test *this)

{
  FieldDescriptor *this_00;
  Descriptor *pDVar1;
  FieldDescriptor *key;
  FieldDescriptor *this_01;
  FieldDescriptor *key_00;
  FieldDescriptor *field;
  void *pvVar2;
  void *pvVar3;
  char *message;
  undefined1 in_R9B;
  RepeatedField<int> *pRVar4;
  Metadata MVar5;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  AssertionResult gtest_ar;
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencer differencer;
  AssertHelper local_380;
  internal local_378 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_370;
  string local_368;
  undefined1 local_348 [184];
  undefined1 local_290 [184];
  MessageDifferencer local_1d8;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_290,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_348,(Arena *)0x0);
  MVar5 = proto2_unittest::TestDiffMessage::GetMetadata
                    ((TestDiffMessage *)proto2_unittest::_TestDiffMessage_default_instance_);
  name._M_str = "item";
  name._M_len = 4;
  this_00 = Descriptor::FindFieldByName(MVar5.descriptor,name);
  pDVar1 = FieldDescriptor::message_type(this_00);
  name_00._M_str = "a";
  name_00._M_len = 1;
  key = Descriptor::FindFieldByName(pDVar1,name_00);
  pDVar1 = FieldDescriptor::message_type(this_00);
  name_01._M_str = "rm";
  name_01._M_len = 2;
  this_01 = Descriptor::FindFieldByName(pDVar1,name_01);
  pDVar1 = FieldDescriptor::message_type(this_01);
  name_02._M_str = "c";
  name_02._M_len = 1;
  key_00 = Descriptor::FindFieldByName(pDVar1,name_02);
  pDVar1 = FieldDescriptor::message_type(this_01);
  name_03._M_str = "rc";
  name_03._M_len = 2;
  field = Descriptor::FindFieldByName(pDVar1,name_03);
  util::MessageDifferencer::MessageDifferencer(&local_1d8);
  util::MessageDifferencer::TreatAsMap(&local_1d8,this_00,key);
  util::MessageDifferencer::TreatAsMap(&local_1d8,this_01,key_00);
  util::MessageDifferencer::TreatAsSet(&local_1d8,field);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_290 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(undefined4 *)((long)pvVar2 + 0x98) = 1;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 4;
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar2 + 0x40),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar3 + 0x48) = 2;
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 2;
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar3 + 0x18),3);
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar3 + 0x18),4);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar2 + 0x40),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar2 + 0x48) = 5;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 2;
  pRVar4 = (RepeatedField<int> *)((long)pvVar2 + 0x18);
  RepeatedField<int>::Add(pRVar4,6);
  RepeatedField<int>::Add(pRVar4,7);
  RepeatedField<int>::Add(pRVar4,8);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_290 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(undefined4 *)((long)pvVar2 + 0x98) = 9;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 4;
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar2 + 0x40),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar3 + 0x48) = 10;
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 2;
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar3 + 0x18),0xb);
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar3 + 0x18),0xc);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar2 + 0x40),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar2 + 0x48) = 0xd;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 2;
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_348 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(undefined4 *)((long)pvVar2 + 0x98) = 1;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 4;
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar2 + 0x40),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar3 + 0x48) = 5;
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 2;
  pRVar4 = (RepeatedField<int> *)((long)pvVar3 + 0x18);
  RepeatedField<int>::Add(pRVar4,8);
  RepeatedField<int>::Add(pRVar4,8);
  RepeatedField<int>::Add(pRVar4,6);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar2 + 0x40),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar2 + 0x48) = 3;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 2;
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar2 + 0x18),2);
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar2 + 0x18),4);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_348 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(undefined4 *)((long)pvVar2 + 0x98) = 9;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 4;
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar2 + 0x40),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar3 + 0x48) = 10;
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 2;
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar3 + 0x18),0xc);
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar3 + 0x18),0xb);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar2 + 0x40),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar2 + 0x48) = 0xd;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 2;
  protobuf::(anonymous_namespace)::MatchingTest::RunWithResult_abi_cxx11_
            (&local_368,&local_1d8,(MessageDifferencer *)local_290,(Message *)local_348,
             (Message *)0x0,(bool)in_R9B);
  testing::internal::CmpHelperEQ<char[922],std::__cxx11::string>
            (local_378,
             "\"matched: item[0].a : 1\\n\" \"matched: item[0].rm[1].c -> item[0].rm[0].c : 5\\n\" \"moved: item[0].rm[1].rc[0] -> item[0].rm[0].rc[2] : 6\\n\" \"moved: item[0].rm[1].rc[2] -> item[0].rm[0].rc[0] : 8\\n\" \"added: item[0].rm[0].rc[1]: 8\\n\" \"deleted: item[0].rm[1].rc[1]: 7\\n\" \"modified: item[0].rm[1] -> item[0].rm[0]: { c: 5 rc: 6 rc: 7 rc: 8 } ->\" \" { c: 5 rc: 8 rc: 8 rc: 6 }\\n\" \"added: item[0].rm[1]: { c: 3 rc: 2 rc: 4 }\\n\" \"deleted: item[0].rm[0]: { c: 2 rc: 3 rc: 4 }\\n\" \"modified: item[0]: { a: 1 rm { c: 2 rc: 3 rc: 4 }\" \" rm { c: 5 rc: 6 rc: 7 rc: 8 } } ->\" \" { a: 1 rm { c: 5 rc: 8 rc: 8 rc: 6 }\" \" rm { c: 3 rc: 2 rc: 4 } }\\n\" \"matched: item[1].a : 9\\n\" \"matched: item[1].rm[0].c : 10\\n\" \"moved: item[1].rm[0].rc[0] -> item[1].rm[0].rc[1] : 11\\n\" \"moved: item[1].rm[0].rc[1] -> item[1].rm[0].rc[0] : 12\\n\" \"matched: item[1].rm[0] : { c: 10 rc: 11 rc: 12 }\\n\" \"matched: item[1].rm[1].c : 13\\n\" \"matched: item[1].rm[1] : { c: 13 }\\n\" \"matched: item[1] : { a: 9 rm { c: 10 rc: 11 rc: 12 } rm { c: 13 } }\\n\""
             ,"RunWithResult(&differencer, msg1, msg2, false)",
             (char (*) [922])
             "matched: item[0].a : 1\nmatched: item[0].rm[1].c -> item[0].rm[0].c : 5\nmoved: item[0].rm[1].rc[0] -> item[0].rm[0].rc[2] : 6\nmoved: item[0].rm[1].rc[2] -> item[0].rm[0].rc[0] : 8\nadded: item[0].rm[0].rc[1]: 8\ndeleted: item[0].rm[1].rc[1]: 7\nmodified: item[0].rm[1] -> item[0].rm[0]: { c: 5 rc: 6 rc: 7 rc: 8 } -> { c: 5 rc: 8 rc: 8 rc: 6 }\nadded: item[0].rm[1]: { c: 3 rc: 2 rc: 4 }\ndeleted: item[0].rm[0]: { c: 2 rc: 3 rc: 4 }\nmodified: item[0]: { a: 1 rm { c: 2 rc: 3 rc: 4 } rm { c: 5 rc: 6 rc: 7 rc: 8 } } -> { a: 1 rm { c: 5 rc: 8 rc: 8 rc: 6 } rm { c: 3 rc: 2 rc: 4 } }\nmatched: item[1].a : 9\nmatched: item[1].rm[0].c : 10\nmoved: item[1].rm[0].rc[0] -> item[1].rm[0].rc[1] : 11\nmoved: item[1].rm[0].rc[1] -> item[1].rm[0].rc[0] : 12\nmatched: item[1].rm[0] : { c: 10 rc: 11 rc: 12 }\nmatched: item[1].rm[1].c : 13\nmatched: item[1].rm[1] : { c: 13 }\nmatched: item[1] : { a: 9 rm { c: 10 rc: 11 rc: 12 } rm { c: 13 } }\n"
             ,&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_368);
    if (local_370 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_370->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x1078,message);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((long *)local_368._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_368._M_dataplus._M_p + 8))();
    }
  }
  if (local_370 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_370,local_370);
  }
  util::MessageDifferencer::~MessageDifferencer(&local_1d8);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_348);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_290);
  return;
}

Assistant:

TEST_F(MatchingTest, MatchAndModifiedInterleaveProperly) {
  proto2_unittest::TestDiffMessage msg1, msg2;
  proto2_unittest::TestDiffMessage::Item* item;
  proto2_unittest::TestField* field;

  const FieldDescriptor* desc;
  const FieldDescriptor* nested_key;
  const FieldDescriptor* nested_desc;
  const FieldDescriptor* double_nested_key;
  const FieldDescriptor* double_nested_desc;
  desc = msg1.GetDescriptor()->FindFieldByName("item");
  nested_key = desc->message_type()->FindFieldByName("a");
  nested_desc = desc->message_type()->FindFieldByName("rm");
  double_nested_key = nested_desc->message_type()->FindFieldByName("c");
  double_nested_desc = nested_desc->message_type()->FindFieldByName("rc");

  MessageDifferencer differencer;
  differencer.TreatAsMap(desc, nested_key);
  differencer.TreatAsMap(nested_desc, double_nested_key);
  differencer.TreatAsSet(double_nested_desc);

  item = msg1.add_item();
  item->set_a(1);
  field = item->add_rm();
  field->set_c(2);
  field->add_rc(3);
  field->add_rc(4);
  field = item->add_rm();
  field->set_c(5);
  field->add_rc(6);
  field->add_rc(7);
  field->add_rc(8);
  item = msg1.add_item();
  item->set_a(9);
  field = item->add_rm();
  field->set_c(10);
  field->add_rc(11);
  field->add_rc(12);
  field = item->add_rm();
  field->set_c(13);

  item = msg2.add_item();
  item->set_a(1);
  field = item->add_rm();
  field->set_c(5);
  field->add_rc(8);
  field->add_rc(8);
  field->add_rc(6);
  field = item->add_rm();
  field->set_c(3);
  field->add_rc(2);
  field->add_rc(4);
  item = msg2.add_item();
  item->set_a(9);
  field = item->add_rm();
  field->set_c(10);
  field->add_rc(12);
  field->add_rc(11);
  field = item->add_rm();
  field->set_c(13);

  EXPECT_EQ(
      "matched: item[0].a : 1\n"
      "matched: item[0].rm[1].c -> item[0].rm[0].c : 5\n"
      "moved: item[0].rm[1].rc[0] -> item[0].rm[0].rc[2] : 6\n"
      "moved: item[0].rm[1].rc[2] -> item[0].rm[0].rc[0] : 8\n"
      "added: item[0].rm[0].rc[1]: 8\n"
      "deleted: item[0].rm[1].rc[1]: 7\n"
      "modified: item[0].rm[1] -> item[0].rm[0]: { c: 5 rc: 6 rc: 7 rc: 8 } ->"
      " { c: 5 rc: 8 rc: 8 rc: 6 }\n"
      "added: item[0].rm[1]: { c: 3 rc: 2 rc: 4 }\n"
      "deleted: item[0].rm[0]: { c: 2 rc: 3 rc: 4 }\n"
      "modified: item[0]: { a: 1 rm { c: 2 rc: 3 rc: 4 }"
      " rm { c: 5 rc: 6 rc: 7 rc: 8 } } ->"
      " { a: 1 rm { c: 5 rc: 8 rc: 8 rc: 6 }"
      " rm { c: 3 rc: 2 rc: 4 } }\n"
      "matched: item[1].a : 9\n"
      "matched: item[1].rm[0].c : 10\n"
      "moved: item[1].rm[0].rc[0] -> item[1].rm[0].rc[1] : 11\n"
      "moved: item[1].rm[0].rc[1] -> item[1].rm[0].rc[0] : 12\n"
      "matched: item[1].rm[0] : { c: 10 rc: 11 rc: 12 }\n"
      "matched: item[1].rm[1].c : 13\n"
      "matched: item[1].rm[1] : { c: 13 }\n"
      "matched: item[1] : { a: 9 rm { c: 10 rc: 11 rc: 12 } rm { c: 13 } }\n",
      RunWithResult(&differencer, msg1, msg2, false));
}